

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O0

_Bool xdr_bytes_decode(XDR *xdrs,char **cpp,u_int *sizep,u_int maxsize)

{
  _Bool _Var1;
  uint local_3c;
  _Bool ret;
  char *pcStack_38;
  uint32_t size;
  char *sp;
  u_int *puStack_28;
  u_int maxsize_local;
  u_int *sizep_local;
  char **cpp_local;
  XDR *xdrs_local;
  
  pcStack_38 = *cpp;
  sp._4_4_ = maxsize;
  puStack_28 = sizep;
  sizep_local = (u_int *)cpp;
  cpp_local = (char **)xdrs;
  _Var1 = xdr_getuint32(xdrs,&local_3c);
  if (_Var1) {
    if (sp._4_4_ < local_3c) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s:%u ERROR size %u > max %u","xdr_bytes_decode",0x252,(ulong)local_3c,
                   (ulong)sp._4_4_);
      }
      xdrs_local._7_1_ = false;
    }
    else {
      *puStack_28 = local_3c;
      if (local_3c == 0) {
        xdrs_local._7_1_ = true;
      }
      else {
        if (pcStack_38 == (char *)0x0) {
          pcStack_38 = (char *)(*__ntirpc_pkg_params.malloc_)
                                         ((ulong)local_3c,
                                          "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/ntirpc/rpc/xdr_inline.h"
                                          ,0x25e,"xdr_bytes_decode");
        }
        xdrs_local._7_1_ = xdr_opaque_decode((XDR *)cpp_local,pcStack_38,local_3c);
        if (xdrs_local._7_1_) {
          *(char **)sizep_local = pcStack_38;
        }
        else if (*(long *)sizep_local == 0) {
          mem_free(pcStack_38,(ulong)local_3c);
        }
      }
    }
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR size","xdr_bytes_decode",0x24c);
    }
    xdrs_local._7_1_ = false;
  }
  return xdrs_local._7_1_;
}

Assistant:

static inline bool
xdr_bytes_decode(XDR *xdrs, char **cpp, u_int *sizep, u_int maxsize)
{
	char *sp = *cpp;	/* sp is the actual string pointer */
	uint32_t size;
	bool ret;

	/*
	 * first deal with the length since xdr bytes are counted
	 */
	if (!XDR_GETUINT32(xdrs, &size)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR size",
			__func__, __LINE__);
		return (false);
	}
	if (size > maxsize) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR size %" PRIu32 " > max %u",
			__func__, __LINE__,
			size, maxsize);
		return (false);
	}
	*sizep = (u_int)size;		/* only valid size */

	/*
	 * now deal with the actual bytes
	 */
	if (!size)
		return (true);
	if (!sp)
		sp = (char *)mem_alloc(size);

	ret = xdr_opaque_decode(xdrs, sp, size);
	if (!ret) {
		if (!*cpp) {
			/* Only free if we allocated */
			mem_free(sp, size);
		}
		return (ret);
	}
	*cpp = sp;			/* only valid pointer */
	return (ret);
}